

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _PDCLIB_filemode.c
# Opt level: O3

int main(void)

{
  uint uVar1;
  
  uVar1 = _PDCLIB_filemode("r");
  if (uVar1 != 8) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_filemode.c, line %d - %s\n"
           ,0x5b,"_PDCLIB_filemode( \"r\" ) == _PDCLIB_FREAD");
  }
  uVar1 = _PDCLIB_filemode("w");
  if (uVar1 != 0x10) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_filemode.c, line %d - %s\n"
           ,0x5c,"_PDCLIB_filemode( \"w\" ) == _PDCLIB_FWRITE");
  }
  uVar1 = _PDCLIB_filemode("a");
  if (uVar1 != 0x30) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_filemode.c, line %d - %s\n"
           ,0x5d,"_PDCLIB_filemode( \"a\" ) == ( _PDCLIB_FAPPEND | _PDCLIB_FWRITE )");
  }
  uVar1 = _PDCLIB_filemode("r+");
  if (uVar1 != 0x48) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_filemode.c, line %d - %s\n"
           ,0x5e,"_PDCLIB_filemode( \"r+\" ) == ( _PDCLIB_FREAD | _PDCLIB_FRW )");
  }
  uVar1 = _PDCLIB_filemode("w+");
  if (uVar1 != 0x50) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_filemode.c, line %d - %s\n"
           ,0x5f,"_PDCLIB_filemode( \"w+\" ) == ( _PDCLIB_FWRITE | _PDCLIB_FRW )");
  }
  uVar1 = _PDCLIB_filemode("a+");
  if (uVar1 != 0x70) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_filemode.c, line %d - %s\n"
           ,0x60,"_PDCLIB_filemode( \"a+\" ) == ( _PDCLIB_FAPPEND | _PDCLIB_FWRITE | _PDCLIB_FRW )")
    ;
  }
  uVar1 = _PDCLIB_filemode("rb");
  if (uVar1 != 0x88) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_filemode.c, line %d - %s\n"
           ,0x61,"_PDCLIB_filemode( \"rb\" ) == ( _PDCLIB_FREAD | _PDCLIB_FBIN )");
  }
  uVar1 = _PDCLIB_filemode("wb");
  if (uVar1 != 0x90) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_filemode.c, line %d - %s\n"
           ,0x62,"_PDCLIB_filemode( \"wb\" ) == ( _PDCLIB_FWRITE | _PDCLIB_FBIN )");
  }
  uVar1 = _PDCLIB_filemode("ab");
  if (uVar1 != 0xb0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_filemode.c, line %d - %s\n"
           ,99,"_PDCLIB_filemode( \"ab\" ) == ( _PDCLIB_FAPPEND | _PDCLIB_FWRITE | _PDCLIB_FBIN )");
  }
  uVar1 = _PDCLIB_filemode("r+b");
  if (uVar1 != 200) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_filemode.c, line %d - %s\n"
           ,100,"_PDCLIB_filemode( \"r+b\" ) == ( _PDCLIB_FREAD | _PDCLIB_FRW | _PDCLIB_FBIN )");
  }
  uVar1 = _PDCLIB_filemode("w+b");
  if (uVar1 != 0xd0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_filemode.c, line %d - %s\n"
           ,0x65,"_PDCLIB_filemode( \"w+b\" ) == ( _PDCLIB_FWRITE | _PDCLIB_FRW | _PDCLIB_FBIN )");
  }
  uVar1 = _PDCLIB_filemode("a+b");
  if (uVar1 != 0xf0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_filemode.c, line %d - %s\n"
           ,0x66,
           "_PDCLIB_filemode( \"a+b\" ) == ( _PDCLIB_FAPPEND | _PDCLIB_FWRITE | _PDCLIB_FRW | _PDCLIB_FBIN )"
          );
  }
  uVar1 = _PDCLIB_filemode("rb+");
  if (uVar1 != 200) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_filemode.c, line %d - %s\n"
           ,0x67,"_PDCLIB_filemode( \"rb+\" ) == ( _PDCLIB_FREAD | _PDCLIB_FRW | _PDCLIB_FBIN )");
  }
  uVar1 = _PDCLIB_filemode("wb+");
  if (uVar1 != 0xd0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_filemode.c, line %d - %s\n"
           ,0x68,"_PDCLIB_filemode( \"wb+\" ) == ( _PDCLIB_FWRITE | _PDCLIB_FRW | _PDCLIB_FBIN )");
  }
  uVar1 = _PDCLIB_filemode("ab+");
  if (uVar1 != 0xf0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_filemode.c, line %d - %s\n"
           ,0x69,
           "_PDCLIB_filemode( \"ab+\" ) == ( _PDCLIB_FAPPEND | _PDCLIB_FWRITE | _PDCLIB_FRW | _PDCLIB_FBIN )"
          );
  }
  uVar1 = _PDCLIB_filemode("x");
  if (uVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_filemode.c, line %d - %s\n"
           ,0x6a,"_PDCLIB_filemode( \"x\" ) == 0");
  }
  uVar1 = _PDCLIB_filemode("r++");
  if (uVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_filemode.c, line %d - %s\n"
           ,0x6b,"_PDCLIB_filemode( \"r++\" ) == 0");
  }
  uVar1 = _PDCLIB_filemode("wbb");
  if (uVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_filemode.c, line %d - %s\n"
           ,0x6c,"_PDCLIB_filemode( \"wbb\" ) == 0");
  }
  uVar1 = _PDCLIB_filemode("a+bx");
  if (uVar1 != 0) {
    TEST_RESULTS = TEST_RESULTS + 1;
    printf("FAILED: /workspace/llm4binary/github/license_c_cmakelists/DevSolar[P]pdclib/functions/_PDCLIB/_PDCLIB_filemode.c, line %d - %s\n"
           ,0x6d,"_PDCLIB_filemode( \"a+bx\" ) == 0");
  }
  return TEST_RESULTS;
}

Assistant:

int main( void )
{
#ifndef REGTEST
    TESTCASE( _PDCLIB_filemode( "r" ) == _PDCLIB_FREAD );
    TESTCASE( _PDCLIB_filemode( "w" ) == _PDCLIB_FWRITE );
    TESTCASE( _PDCLIB_filemode( "a" ) == ( _PDCLIB_FAPPEND | _PDCLIB_FWRITE ) );
    TESTCASE( _PDCLIB_filemode( "r+" ) == ( _PDCLIB_FREAD | _PDCLIB_FRW ) );
    TESTCASE( _PDCLIB_filemode( "w+" ) == ( _PDCLIB_FWRITE | _PDCLIB_FRW ) );
    TESTCASE( _PDCLIB_filemode( "a+" ) == ( _PDCLIB_FAPPEND | _PDCLIB_FWRITE | _PDCLIB_FRW ) );
    TESTCASE( _PDCLIB_filemode( "rb" ) == ( _PDCLIB_FREAD | _PDCLIB_FBIN ) );
    TESTCASE( _PDCLIB_filemode( "wb" ) == ( _PDCLIB_FWRITE | _PDCLIB_FBIN ) );
    TESTCASE( _PDCLIB_filemode( "ab" ) == ( _PDCLIB_FAPPEND | _PDCLIB_FWRITE | _PDCLIB_FBIN ) );
    TESTCASE( _PDCLIB_filemode( "r+b" ) == ( _PDCLIB_FREAD | _PDCLIB_FRW | _PDCLIB_FBIN ) );
    TESTCASE( _PDCLIB_filemode( "w+b" ) == ( _PDCLIB_FWRITE | _PDCLIB_FRW | _PDCLIB_FBIN ) );
    TESTCASE( _PDCLIB_filemode( "a+b" ) == ( _PDCLIB_FAPPEND | _PDCLIB_FWRITE | _PDCLIB_FRW | _PDCLIB_FBIN ) );
    TESTCASE( _PDCLIB_filemode( "rb+" ) == ( _PDCLIB_FREAD | _PDCLIB_FRW | _PDCLIB_FBIN ) );
    TESTCASE( _PDCLIB_filemode( "wb+" ) == ( _PDCLIB_FWRITE | _PDCLIB_FRW | _PDCLIB_FBIN ) );
    TESTCASE( _PDCLIB_filemode( "ab+" ) == ( _PDCLIB_FAPPEND | _PDCLIB_FWRITE | _PDCLIB_FRW | _PDCLIB_FBIN ) );
    TESTCASE( _PDCLIB_filemode( "x" ) == 0 );
    TESTCASE( _PDCLIB_filemode( "r++" ) == 0 );
    TESTCASE( _PDCLIB_filemode( "wbb" ) == 0 );
    TESTCASE( _PDCLIB_filemode( "a+bx" ) == 0 );
#endif
    return TEST_RESULTS;
}